

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Nonnull<char_*> pcVar1;
  size_t in_R9;
  string_view format;
  long local_68;
  Nonnull<char_*> local_60;
  ulong local_58;
  long local_50;
  long local_48;
  Nonnull<char_*> local_40;
  char local_38 [32];
  
  pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)(*(long *)this + 0x4c),local_38);
  local_68 = (long)pcVar1 - (long)local_38;
  local_58 = (ulong)**(ushort **)(**(long **)(this + 8) + 0x10);
  local_50 = ~local_58 + (long)*(ushort **)(**(long **)(this + 8) + 0x10);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_68;
  format._M_len = (size_t)"FieldDescriptorProto.oneof_index $0 is out of range for type \"$1\".";
  local_60 = local_38;
  local_48 = local_68;
  local_40 = local_38;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x42,format,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}